

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O2

_Bool fb_urange_iter(fb_group_t *fb,size_t nbits,size_t start,size_t *r_begin,size_t *r_len)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  fb_group_t fVar7;
  
  uVar4 = nbits >> 6;
  uVar2 = nbits & 0xffffffffffffffc0;
  uVar6 = (~fb[uVar4] >> ((byte)nbits & 0x3f)) << ((byte)nbits & 0x3f);
  while (uVar6 == 0) {
    if (uVar4 == 7) {
      return false;
    }
    lVar1 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    uVar2 = uVar2 + 0x40;
    uVar6 = ~fb[lVar1];
  }
  if (0x1ff < uVar2) {
    return false;
  }
  lVar1 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar6 = uVar4 & 0x3ffffffffffffff;
  fVar7 = (fb[uVar6] >> ((byte)lVar1 & 0x3f)) << ((byte)lVar1 & 0x3f);
  lVar5 = uVar4 * -0x40;
  do {
    if (fVar7 != 0) {
      lVar3 = 0;
      if (fVar7 != 0) {
        for (; (fVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      lVar3 = lVar3 - lVar5;
LAB_01e9139b:
      *(ulong *)start = lVar1 + uVar2;
      *r_begin = (lVar3 - lVar1) - uVar2;
      return true;
    }
    if (uVar6 == 7) {
      lVar3 = 0x200;
      goto LAB_01e9139b;
    }
    fVar7 = fb[uVar6 + 1];
    lVar5 = lVar5 + -0x40;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static inline bool
fb_urange_iter(fb_group_t *fb, size_t nbits, size_t start, size_t *r_begin,
    size_t *r_len) {
	return fb_iter_range_impl(fb, nbits, start, r_begin, r_len,
	    /* val */ false, /* forward */ true);
}